

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void vli_mmod_fast_secp256r1(uint *result,uint *product)

{
  uint *puVar1;
  wordcount_t i;
  int iVar2;
  long lVar3;
  uint uVar4;
  wordcount_t i_1;
  uint uVar5;
  wordcount_t i_6;
  uint uVar6;
  wordcount_t i_2;
  uint uVar7;
  wordcount_t i_3;
  ulong uVar8;
  wordcount_t i_4;
  uint uVar9;
  wordcount_t i_5;
  uint uVar10;
  wordcount_t i_9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  wordcount_t i_7;
  uint uVar14;
  wordcount_t i_8;
  uint uVar15;
  uint uVar16;
  uint local_58 [2];
  uint tmp [8];
  
  lVar3 = 0;
  do {
    result[lVar3] = product[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = 0;
  tmp[1] = product[0xb];
  tmp[2] = product[0xc];
  tmp[3] = product[0xd];
  tmp[4] = product[0xe];
  tmp[5] = product[0xf];
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar7 = tmp[lVar3 + -2];
    uVar5 = uVar4 + uVar7 * 2;
    if (uVar5 != uVar7) {
      uVar4 = 0;
    }
    uVar4 = uVar4 | uVar5 < uVar7;
    tmp[lVar3 + -2] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar7 = result[lVar3];
    uVar9 = uVar7 + uVar5 + tmp[lVar3 + -2];
    if (uVar9 != uVar7) {
      uVar5 = 0;
    }
    uVar5 = uVar5 | uVar9 < uVar7;
    result[lVar3] = uVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[1] = product[0xc];
  tmp[2] = product[0xd];
  tmp[3] = product[0xe];
  tmp[4] = product[0xf];
  tmp[5] = 0;
  lVar3 = 0;
  uVar7 = 0;
  do {
    uVar9 = tmp[lVar3 + -2];
    uVar10 = uVar7 + uVar9 * 2;
    if (uVar10 != uVar9) {
      uVar7 = 0;
    }
    uVar7 = uVar7 | uVar10 < uVar9;
    tmp[lVar3 + -2] = uVar10;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  uVar9 = 0;
  do {
    uVar10 = result[lVar3];
    uVar6 = uVar10 + uVar9 + tmp[lVar3 + -2];
    if (uVar6 != uVar10) {
      uVar9 = 0;
    }
    uVar9 = uVar9 | uVar6 < uVar10;
    result[lVar3] = uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = product[10];
  tmp[3] = 0;
  tmp[1] = 0;
  tmp[2] = 0;
  tmp[4] = product[0xe];
  tmp[5] = product[0xf];
  lVar3 = 0;
  uVar10 = 0;
  do {
    uVar6 = result[lVar3];
    uVar14 = uVar6 + uVar10 + tmp[lVar3 + -2];
    if (uVar14 != uVar6) {
      uVar10 = 0;
    }
    uVar10 = uVar10 | uVar14 < uVar6;
    result[lVar3] = uVar14;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = product[0xb];
  tmp[1] = product[0xd];
  tmp[2] = product[0xe];
  tmp[3] = product[0xf];
  tmp[4] = product[0xd];
  tmp[5] = product[8];
  lVar3 = 0;
  uVar6 = 0;
  do {
    uVar14 = result[lVar3];
    uVar15 = uVar14 + uVar6 + tmp[lVar3 + -2];
    if (uVar15 != uVar14) {
      uVar6 = 0;
    }
    uVar6 = uVar6 | uVar15 < uVar14;
    result[lVar3] = uVar15;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = product[0xd];
  tmp[3] = 0;
  tmp[1] = 0;
  tmp[2] = 0;
  tmp[4] = product[8];
  tmp[5] = product[10];
  lVar3 = 0;
  uVar14 = 0;
  do {
    uVar16 = tmp[lVar3 + -2] + uVar14;
    puVar1 = result + lVar3;
    uVar15 = *puVar1;
    *puVar1 = *puVar1 - uVar16;
    if (uVar16 != 0) {
      uVar14 = 0;
    }
    uVar14 = uVar14 | uVar15 < uVar16;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = product[0xe];
  tmp[1] = product[0xf];
  tmp[2] = 0;
  tmp[3] = 0;
  tmp[4] = product[9];
  tmp[5] = product[0xb];
  lVar3 = 0;
  uVar15 = 0;
  do {
    uVar11 = tmp[lVar3 + -2] + uVar15;
    puVar1 = result + lVar3;
    uVar16 = *puVar1;
    *puVar1 = *puVar1 - uVar11;
    if (uVar11 != 0) {
      uVar15 = 0;
    }
    uVar15 = uVar15 | uVar16 < uVar11;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = product[0xf];
  tmp[1] = product[8];
  tmp[2] = product[9];
  tmp[3] = product[10];
  tmp[4] = 0;
  tmp[5] = product[0xc];
  lVar3 = 0;
  uVar16 = 0;
  do {
    uVar12 = tmp[lVar3 + -2] + uVar16;
    puVar1 = result + lVar3;
    uVar11 = *puVar1;
    *puVar1 = *puVar1 - uVar12;
    if (uVar12 != 0) {
      uVar16 = 0;
    }
    uVar16 = uVar16 | uVar11 < uVar12;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  tmp[0] = 0;
  tmp[1] = product[9];
  tmp[2] = product[10];
  tmp[3] = product[0xb];
  tmp[4] = 0;
  tmp[5] = product[0xd];
  lVar3 = 0;
  uVar11 = 0;
  do {
    uVar13 = tmp[lVar3 + -2] + uVar11;
    puVar1 = result + lVar3;
    uVar12 = *puVar1;
    *puVar1 = *puVar1 - uVar13;
    if (uVar13 != 0) {
      uVar11 = 0;
    }
    uVar11 = uVar11 | uVar12 < uVar13;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  iVar2 = (uVar9 + uVar10 + uVar6 + uVar5 + uVar4 + uVar7) - (uVar14 + uVar15 + uVar16 + uVar11);
  if (iVar2 < 0) {
    do {
      lVar3 = 0;
      uVar4 = 0;
      do {
        uVar5 = result[lVar3];
        uVar7 = uVar5 + uVar4 + curve_secp256r1.p[lVar3];
        if (uVar7 != uVar5) {
          uVar4 = 0;
        }
        uVar4 = uVar4 | uVar7 < uVar5;
        result[lVar3] = uVar7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      iVar2 = iVar2 + uVar4;
    } while (iVar2 < 0);
    return;
  }
  do {
    if (iVar2 == 0) {
      uVar4 = 7;
      do {
        if ((char)uVar4 < '\0') break;
        uVar8 = (ulong)((uVar4 & 0x7f) << 2);
        uVar5 = *(uint *)((long)curve_secp256r1.p + uVar8);
        uVar7 = *(uint *)((long)result + uVar8);
        if (uVar7 < uVar5) {
          return;
        }
        uVar4 = uVar4 - 1;
      } while (uVar7 <= uVar5);
    }
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar7 = curve_secp256r1.p[lVar3] + uVar4;
      puVar1 = result + lVar3;
      uVar5 = *puVar1;
      *puVar1 = *puVar1 - uVar7;
      if (uVar7 != 0) {
        uVar4 = 0;
      }
      uVar4 = uVar4 | uVar5 < uVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    iVar2 = iVar2 - uVar4;
  } while( true );
}

Assistant:

void vli_mmod_fast_secp256r1(unsigned int *result, unsigned int*product)
{
	unsigned int tmp[NUM_ECC_WORDS];
	int carry;

	/* t */
	tc_uECC_vli_set(result, product, NUM_ECC_WORDS);

	/* s1 */
	tmp[0] = tmp[1] = tmp[2] = 0;
	tmp[3] = product[11];
	tmp[4] = product[12];
	tmp[5] = product[13];
	tmp[6] = product[14];
	tmp[7] = product[15];
	carry = tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s2 */
	tmp[3] = product[12];
	tmp[4] = product[13];
	tmp[5] = product[14];
	tmp[6] = product[15];
	tmp[7] = 0;
	carry += tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s3 */
	tmp[0] = product[8];
	tmp[1] = product[9];
	tmp[2] = product[10];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[14];
	tmp[7] = product[15];
  	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s4 */
	tmp[0] = product[9];
	tmp[1] = product[10];
	tmp[2] = product[11];
	tmp[3] = product[13];
	tmp[4] = product[14];
	tmp[5] = product[15];
	tmp[6] = product[13];
	tmp[7] = product[8];
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* d1 */
	tmp[0] = product[11];
	tmp[1] = product[12];
	tmp[2] = product[13];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[8];
	tmp[7] = product[10];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d2 */
	tmp[0] = product[12];
	tmp[1] = product[13];
	tmp[2] = product[14];
	tmp[3] = product[15];
	tmp[4] = tmp[5] = 0;
	tmp[6] = product[9];
	tmp[7] = product[11];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d3 */
	tmp[0] = product[13];
	tmp[1] = product[14];
	tmp[2] = product[15];
	tmp[3] = product[8];
	tmp[4] = product[9];
	tmp[5] = product[10];
	tmp[6] = 0;
	tmp[7] = product[12];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d4 */
	tmp[0] = product[14];
	tmp[1] = product[15];
	tmp[2] = 0;
	tmp[3] = product[9];
	tmp[4] = product[10];
	tmp[5] = product[11];
	tmp[6] = 0;
	tmp[7] = product[13];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	if (carry < 0) {
		do {
			carry += tc_uECC_vli_add(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
		while (carry < 0);
	} else  {
		while (carry ||
		       tc_uECC_vli_cmp_unsafe(curve_secp256r1.p, result, NUM_ECC_WORDS) != 1) {
			carry -= tc_uECC_vli_sub(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
	}
}